

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

double anon_unknown.dwarf_1353dc::standard_deviation(iterator first,iterator last)

{
  iterator iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  iVar1._M_current = first._M_current;
  if (first._M_current != last._M_current) {
    do {
      dVar3 = dVar3 + *iVar1._M_current;
      iVar1._M_current = iVar1._M_current + 1;
    } while (iVar1._M_current != last._M_current);
  }
  dVar4 = (double)((long)last._M_current - (long)first._M_current >> 3);
  if (last._M_current != first._M_current) {
    dVar2 = 0.0;
    do {
      dVar5 = *first._M_current - dVar3 / dVar4;
      dVar2 = dVar2 + dVar5 * dVar5;
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  dVar2 = dVar2 / dVar4;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
    return dVar2;
  }
  return SQRT(dVar2);
}

Assistant:

double standard_deviation(std::vector<double>::iterator first, std::vector<double>::iterator last) {
        auto m = Catch::Benchmark::Detail::mean(first, last);
        double variance = std::accumulate(first, last, 0., [m](double a, double b) {
            double diff = b - m;
            return a + diff * diff;
            }) / (last - first);
            return std::sqrt(variance);
    }